

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O2

void __thiscall
CGameClient::EvolveCharacter(CGameClient *this,CNetObj_Character *pCharacter,int Tick)

{
  int iVar1;
  long in_FS_OFFSET;
  CCharacterCore TempCore;
  CWorldCore TempWorld;
  CCharacterCore local_330;
  CWorldCore local_2b0;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  CWorldCore::CWorldCore(&local_2b0);
  mem_zero(&local_330,0x80);
  CCharacterCore::Init(&local_330,&local_2b0,&this->m_Collision);
  CCharacterCore::Read(&local_330,&pCharacter->super_CNetObj_CharacterCore);
  while (iVar1 = (pCharacter->super_CNetObj_CharacterCore).m_Tick, iVar1 < Tick) {
    (pCharacter->super_CNetObj_CharacterCore).m_Tick = iVar1 + 1;
    CCharacterCore::Tick(&local_330,false);
    CCharacterCore::Move(&local_330);
    CCharacterCore::Quantize(&local_330);
  }
  CCharacterCore::Write(&local_330,&pCharacter->super_CNetObj_CharacterCore);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGameClient::EvolveCharacter(CNetObj_Character *pCharacter, int Tick)
{
	CWorldCore TempWorld;
	CCharacterCore TempCore;
	mem_zero(&TempCore, sizeof(TempCore));
	TempCore.Init(&TempWorld, Collision());
	TempCore.Read(pCharacter);

	while(pCharacter->m_Tick < Tick)
	{
		pCharacter->m_Tick++;
		TempCore.Tick(false);
		TempCore.Move();
		TempCore.Quantize();
	}

	TempCore.Write(pCharacter);
}